

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

int __thiscall banksia::ChessBoard::findKing(ChessBoard *this,Side side)

{
  pointer pPVar1;
  long lVar2;
  
  pPVar1 = (this->super_BoardCore).pieces.
           super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar2 = 0;
  while( true ) {
    if ((int)((ulong)((long)(this->super_BoardCore).pieces.
                            super__Vector_base<banksia::Piece,_std::allocator<banksia::Piece>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)pPVar1) >> 3) <= lVar2
       ) {
      return -1;
    }
    if ((pPVar1[lVar2].type == king) && (pPVar1[lVar2].side == side)) break;
    lVar2 = lVar2 + 1;
  }
  return (int)lVar2;
}

Assistant:

int ChessBoard::findKing(Side side) const
{
    for (int pos = 0; pos < int(pieces.size()); ++pos) {
        if (isPiece(pos, PieceType::king, side)) {
            return pos;
        }
    }
    return -1;
}